

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O2

REStackFrame * __thiscall icu_63::RegexMatcher::resetStack(RegexMatcher *this)

{
  int iVar1;
  REStackFrame *pRVar2;
  int iVar3;
  ulong uVar4;
  
  UVector64::removeAllElements(this->fStack);
  pRVar2 = (REStackFrame *)
           UVector64::reserveBlock(this->fStack,this->fPattern->fFrameSize,&this->fDeferredStatus);
  if (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = this->fPattern->fFrameSize;
    iVar3 = 2;
    if (2 < iVar1) {
      iVar3 = iVar1;
    }
    for (uVar4 = 0; iVar3 - 2 != uVar4; uVar4 = uVar4 + 1) {
      pRVar2->fExtra[uVar4] = -1;
    }
  }
  else {
    pRVar2 = (REStackFrame *)0x0;
  }
  return pRVar2;
}

Assistant:

REStackFrame *RegexMatcher::resetStack() {
    // Discard any previous contents of the state save stack, and initialize a
    //  new stack frame with all -1 data.  The -1s are needed for capture group limits,
    //  where they indicate that a group has not yet matched anything.
    fStack->removeAllElements();

    REStackFrame *iFrame = (REStackFrame *)fStack->reserveBlock(fPattern->fFrameSize, fDeferredStatus);
    if(U_FAILURE(fDeferredStatus)) {
        return NULL;
    }

    int32_t i;
    for (i=0; i<fPattern->fFrameSize-RESTACKFRAME_HDRCOUNT; i++) {
        iFrame->fExtra[i] = -1;
    }
    return iFrame;
}